

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall
ChainstateManager::LoadExternalBlockFile
          (ChainstateManager *this,AutoFile *file_in,FlatFilePos *dbp,
          multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
          *blocks_with_unknown_parent)

{
  BlockManager *this_00;
  CChainParams *__nbytes;
  Chainstate *this_01;
  pointer ppCVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  iterator __position;
  base_blob<256U> *pbVar5;
  pointer ppCVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  pointer __s;
  CBlockIndex *pCVar12;
  Logger *pLVar13;
  _Base_ptr p_Var14;
  long lVar15;
  byte bVar16;
  uint64_t uVar17;
  char *pcVar18;
  _Self __tmp;
  ulong uVar19;
  _Map_pointer ppuVar20;
  pointer ppCVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view source_file;
  string_view source_file_00;
  shared_ptr<const_CBlock> pblock;
  shared_ptr<const_CBlock> pblock_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>_>
  pVar28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_300;
  ulong local_2f0;
  uint local_2d4;
  shared_ptr<CBlock> pblockrecursive;
  _Map_pointer local_2a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_298;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_290;
  undefined1 local_278 [16];
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_268;
  BufferedFile blkdat;
  int nLoaded;
  uint32_t obj;
  undefined1 local_201;
  TransactionSerParams *local_200;
  BufferedFile *local_1f8;
  BlockValidationState dummy;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  undefined1 local_198 [16];
  uint256 local_188;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock38;
  deque<uint256,_std::allocator<uint256>_> queue;
  BlockValidationState state_1;
  uint256 hash;
  MessageStartChars buf;
  undefined1 auStack_84 [12];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dbp != (FlatFilePos *)0x0) !=
      (blocks_with_unknown_parent !=
      (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
       *)0x0)) {
    __assert_fail("!dbp == !blocks_with_unknown_parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x139f,
                  "void ChainstateManager::LoadExternalBlockFile(AutoFile &, FlatFilePos *, std::multimap<uint256, FlatFilePos> *)"
                 );
  }
  lVar11 = std::chrono::_V2::steady_clock::now();
  __nbytes = (this->m_options).chainparams;
  nLoaded = 0;
  blkdat.nSrcPos = 0;
  blkdat.m_read_pos = 0;
  blkdat.nReadLimit = 0xffffffffffffffff;
  blkdat.nRewind = 0x3d0908;
  blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  blkdat.m_src = file_in;
  __s = (pointer)operator_new(8000000);
  blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = __s;
  blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 8000000;
  memset(__s,0,8000000);
  blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 8000000;
  this_00 = &this->m_blockman;
  uVar19 = blkdat.m_read_pos;
  while ((blkdat.m_read_pos != blkdat.nSrcPos ||
         (iVar10 = feof((FILE *)(blkdat.m_src)->m_file), iVar10 == 0))) {
    bVar8 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
    if (bVar8) {
      if (blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)blkdat.vchBuf.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)blkdat.vchBuf.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      goto LAB_0040a116;
    }
    blkdat.m_read_pos = uVar19;
    if (blkdat.nSrcPos < uVar19) {
      blkdat.m_read_pos = blkdat.nSrcPos;
    }
    if (((long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start) + uVar19 < blkdat.nSrcPos) {
      blkdat.m_read_pos =
           blkdat.nSrcPos -
           ((long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    blkdat.nReadLimit = 0xffffffffffffffff;
    uVar17 = blkdat.nSrcPos;
    BufferedFile::FindByte(&blkdat,(__nbytes->pchMessageStart)._M_elems[0]);
    uVar19 = blkdat.m_read_pos + 1;
    BufferedFile::read(&blkdat,(int)&buf,(void *)0x4,uVar17);
    if (buf._M_elems == *&(__nbytes->pchMessageStart)._M_elems) {
      BufferedFile::read(&blkdat,(int)&obj,(void *)0x4,(size_t)__nbytes);
      local_2f0 = (ulong)obj;
      bVar8 = obj - 0x50 < 0x3d08b1;
    }
    else {
      local_2f0 = 0;
      bVar8 = false;
    }
    uVar17 = blkdat.m_read_pos;
    if (bVar8) {
      if (dbp != (FlatFilePos *)0x0) {
        dbp->nPos = (uint)blkdat.m_read_pos;
      }
      bVar8 = CARRY8(local_2f0,blkdat.m_read_pos);
      local_2f0 = local_2f0 + blkdat.m_read_pos;
      if (!bVar8) {
        blkdat.nReadLimit = local_2f0;
      }
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      local_68 = (undefined1  [16])0x0;
      local_78 = (undefined1  [16])0x0;
      _buf = (undefined1  [16])0x0;
      pcVar18 = local_68 + 4;
      ActionUnserialize::
      SerReadWriteMany<BufferedFile,int&,uint256&,uint256&,unsigned_int&,unsigned_int&,unsigned_int&>
                (&blkdat,(int *)&buf,(uint256 *)auStack_84,(uint256 *)pcVar18,(uint *)(local_48 + 4)
                 ,(uint *)(local_48 + 8),(uint *)(local_48 + 0xc));
      CBlockHeader::GetHash(&hash,(CBlockHeader *)&buf);
      BufferedFile::SkipTo(&blkdat,local_2f0);
      criticalblock38.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock38.super_unique_lock._8_8_ =
           criticalblock38.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock38.super_unique_lock);
      auVar25[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[0]
                    == hash.super_base_blob<256U>.m_data._M_elems[0]);
      auVar25[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[1]
                    == hash.super_base_blob<256U>.m_data._M_elems[1]);
      auVar25[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[2]
                    == hash.super_base_blob<256U>.m_data._M_elems[2]);
      auVar25[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[3]
                    == hash.super_base_blob<256U>.m_data._M_elems[3]);
      auVar25[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[4]
                    == hash.super_base_blob<256U>.m_data._M_elems[4]);
      auVar25[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[5]
                    == hash.super_base_blob<256U>.m_data._M_elems[5]);
      auVar25[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[6]
                    == hash.super_base_blob<256U>.m_data._M_elems[6]);
      auVar25[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[7]
                    == hash.super_base_blob<256U>.m_data._M_elems[7]);
      auVar25[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[8]
                    == hash.super_base_blob<256U>.m_data._M_elems[8]);
      auVar25[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems[9]
                    == hash.super_base_blob<256U>.m_data._M_elems[9]);
      auVar25[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                      [10] == hash.super_base_blob<256U>.m_data._M_elems[10]);
      auVar25[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0xb] == hash.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar25[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0xc] == hash.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar25[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0xd] == hash.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar25[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0xe] == hash.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar25[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0xf] == hash.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar22[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x10] == hash.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar22[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x11] == hash.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar22[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x12] == hash.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar22[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x13] == hash.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar22[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x14] == hash.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar22[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x15] == hash.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar22[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x16] == hash.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar22[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x17] == hash.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar22[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x18] == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar22[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                     [0x19] == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar22[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                      [0x1a] == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar22[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x1b] == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar22[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x1c] == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar22[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x1d] == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar22[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x1e] == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar22[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x1f] == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar22 = auVar22 & auVar25;
      if (((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff) ||
         (pCVar12 = ::node::BlockManager::LookupBlockIndex(this_00,(uint256 *)auStack_84),
         pCVar12 != (CBlockIndex *)0x0)) {
        pCVar12 = ::node::BlockManager::LookupBlockIndex(this_00,&hash);
        if ((pCVar12 == (CBlockIndex *)0x0) || ((pCVar12->nStatus & 8) == 0)) {
          blkdat.m_read_pos = uVar17;
          if (blkdat.nSrcPos < uVar17) {
            blkdat.m_read_pos = blkdat.nSrcPos;
          }
          if (((long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                     .super__Vector_impl_data._M_finish -
              (long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start) + uVar17 < blkdat.nSrcPos) {
            blkdat.m_read_pos =
                 blkdat.nSrcPos -
                 ((long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                       _M_impl.super__Vector_impl_data._M_start);
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Deque_impl_data._M_map_size;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _0_16_ = auVar2 << 0x40;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<CBlock,std::allocator<CBlock>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Deque_impl_data._M_map_size,(CBlock **)&queue,
                     (allocator<CBlock> *)&local_201);
          ppuVar20 = queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_map;
          sVar7 = queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_map_size;
          local_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Deque_impl_data._M_map_size;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_map = (_Map_pointer)0x0;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_map_size = 0;
          local_200 = &::TX_WITH_WITNESS;
          local_1f8 = &blkdat;
          CBlock::
          SerializationOps<ParamsStream<BufferedFile&,TransactionSerParams>,CBlock,ActionUnserialize>
                    (ppuVar20,&local_200);
          local_2f0 = blkdat.m_read_pos;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _0_16_ = auVar3 << 0x40;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_start._0_9_ = ZEXT89(0);
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first;
          queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.super__Deque_impl_data.
          _M_finish._0_9_ = ZEXT89(0);
          dummy.super_ValidationState<BlockValidationResult>._0_8_ = ppuVar20;
          dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)sVar7;
          if (sVar7 != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(sVar7 + 8) = *(int *)(sVar7 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(sVar7 + 8) = *(int *)(sVar7 + 8) + 1;
            }
          }
          pcVar18 = (char *)0x0;
          bVar8 = AcceptBlock(this,(shared_ptr<const_CBlock> *)&dummy,(BlockValidationState *)&queue
                              ,(CBlockIndex **)0x0,true,dbp,(bool *)0x0,true);
          if (dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
              (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                       _M_dataplus._M_p);
          }
          if (bVar8) {
            nLoaded = nLoaded + 1;
          }
          iVar10 = (int)queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Deque_impl_data._M_map;
          if (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._M_start._M_node !=
              &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first) {
            operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node,
                            (ulong)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>.
                                      _M_impl.super__Deque_impl_data._M_finish._M_first)->
                                    super_base_blob<256U>).m_data._M_elems + 1));
          }
          if ((_Elt_pointer *)
              queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._M_map_size !=
              &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Deque_impl_data._M_start._M_first) {
            operator_delete((void *)queue.super__Deque_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Deque_impl_data._M_map_size,
                            (ulong)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_first)->
                                    super_base_blob<256U>).m_data._M_elems + 1));
          }
          iVar10 = (uint)(iVar10 == 2) * 3;
        }
        else {
          auVar26[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0] == hash.super_base_blob<256U>.m_data._M_elems[0]);
          auVar26[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[1] == hash.super_base_blob<256U>.m_data._M_elems[1]);
          auVar26[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[2] == hash.super_base_blob<256U>.m_data._M_elems[2]);
          auVar26[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[3] == hash.super_base_blob<256U>.m_data._M_elems[3]);
          auVar26[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[4] == hash.super_base_blob<256U>.m_data._M_elems[4]);
          auVar26[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[5] == hash.super_base_blob<256U>.m_data._M_elems[5]);
          auVar26[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[6] == hash.super_base_blob<256U>.m_data._M_elems[6]);
          auVar26[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[7] == hash.super_base_blob<256U>.m_data._M_elems[7]);
          auVar26[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[8] == hash.super_base_blob<256U>.m_data._M_elems[8]);
          auVar26[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[9] == hash.super_base_blob<256U>.m_data._M_elems[9]);
          auVar26[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                          _M_elems[10] == hash.super_base_blob<256U>.m_data._M_elems[10]);
          auVar26[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0xb] == hash.super_base_blob<256U>.m_data._M_elems[0xb]);
          auVar26[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0xc] == hash.super_base_blob<256U>.m_data._M_elems[0xc]);
          auVar26[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0xd] == hash.super_base_blob<256U>.m_data._M_elems[0xd]);
          auVar26[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0xe] == hash.super_base_blob<256U>.m_data._M_elems[0xe]);
          auVar26[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0xf] == hash.super_base_blob<256U>.m_data._M_elems[0xf]);
          auVar23[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x10] == hash.super_base_blob<256U>.m_data._M_elems[0x10]);
          auVar23[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x11] == hash.super_base_blob<256U>.m_data._M_elems[0x11]);
          auVar23[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x12] == hash.super_base_blob<256U>.m_data._M_elems[0x12]);
          auVar23[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x13] == hash.super_base_blob<256U>.m_data._M_elems[0x13]);
          auVar23[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x14] == hash.super_base_blob<256U>.m_data._M_elems[0x14]);
          auVar23[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x15] == hash.super_base_blob<256U>.m_data._M_elems[0x15]);
          auVar23[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x16] == hash.super_base_blob<256U>.m_data._M_elems[0x16]);
          auVar23[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x17] == hash.super_base_blob<256U>.m_data._M_elems[0x17]);
          auVar23[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x18] == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
          auVar23[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x19] == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
          auVar23[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                          _M_elems[0x1a] == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
          auVar23[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x1b] == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
          auVar23[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x1c] == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
          auVar23[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x1d] == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
          auVar23[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x1e] == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
          auVar23[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x1f] == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
          auVar23 = auVar23 & auVar26;
          if (((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) &&
             ((pCVar12->nHeight * 0x26e978d5 + 0x10624d8U >> 3 | pCVar12->nHeight * -0x60000000) <
              0x418937)) {
            pLVar13 = LogInstance();
            bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar13,REINDEX,Debug);
            if (bVar8) {
              base_blob<256u>::ToString_abi_cxx11_((string *)&queue,&hash);
              logging_function._M_str = "LoadExternalBlockFile";
              logging_function._M_len = 0x15;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file._M_len = 0x5e;
              pcVar18 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              LogPrintFormatInternal<std::__cxx11::string,int>
                        (logging_function,source_file,0x13f0,REINDEX,Debug,
                         (ConstevalFormatString<2U>)0x8233af,(string *)&queue,&pCVar12->nHeight);
              if ((iterator *)
                  queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_map !=
                  &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Deque_impl_data._M_start) {
                operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                                super__Deque_impl_data._M_map,
                                (ulong)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                        super_base_blob<256U>).m_data._M_elems + 1));
              }
            }
          }
          local_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ppuVar20 = (_Map_pointer)0x0;
          iVar10 = 0;
        }
      }
      else {
        pLVar13 = LogInstance();
        bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar13,REINDEX,Debug);
        if (bVar8) {
          base_blob<256u>::ToString_abi_cxx11_((string *)&queue,&hash);
          base_blob<256u>::ToString_abi_cxx11_((string *)&dummy,auStack_84);
          logging_function_00._M_str = "LoadExternalBlockFile";
          logging_function_00._M_len = 0x15;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_00._M_len = 0x5e;
          pcVar18 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          LogPrintFormatInternal<char[22],std::__cxx11::string,std::__cxx11::string>
                    (logging_function_00,source_file_00,0x13d8,REINDEX,Debug,
                     (ConstevalFormatString<3U>)0x82337f,(char (*) [22])"LoadExternalBlockFile",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queue,
                     (string *)&dummy);
          if ((size_type *)dummy.super_ValidationState<BlockValidationResult>._0_8_ !=
              &dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length)
          {
            operator_delete((void *)dummy.super_ValidationState<BlockValidationResult>._0_8_,
                            dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                            _M_string_length + 1);
          }
          if ((iterator *)
              queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._M_map !=
              &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Deque_impl_data._M_start) {
            operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Deque_impl_data._M_map,
                            (ulong)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_cur)->
                                    super_base_blob<256U>).m_data._M_elems + 1));
          }
        }
        iVar10 = 2;
        if (dbp != (FlatFilePos *)0x0 &&
            blocks_with_unknown_parent !=
            (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
             *)0x0) {
          std::
          _Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
          ::_M_emplace_equal<uint256&,FlatFilePos&>
                    ((_Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
                      *)blocks_with_unknown_parent,(uint256 *)auStack_84,dbp);
        }
        local_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ppuVar20 = (_Map_pointer)0x0;
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock38.super_unique_lock);
      if (iVar10 == 0) {
        auVar27[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0] == hash.super_base_blob<256U>.m_data._M_elems[0]);
        auVar27[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [1] == hash.super_base_blob<256U>.m_data._M_elems[1]);
        auVar27[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [2] == hash.super_base_blob<256U>.m_data._M_elems[2]);
        auVar27[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [3] == hash.super_base_blob<256U>.m_data._M_elems[3]);
        auVar27[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [4] == hash.super_base_blob<256U>.m_data._M_elems[4]);
        auVar27[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [5] == hash.super_base_blob<256U>.m_data._M_elems[5]);
        auVar27[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [6] == hash.super_base_blob<256U>.m_data._M_elems[6]);
        auVar27[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [7] == hash.super_base_blob<256U>.m_data._M_elems[7]);
        auVar27[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [8] == hash.super_base_blob<256U>.m_data._M_elems[8]);
        auVar27[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [9] == hash.super_base_blob<256U>.m_data._M_elems[9]);
        auVar27[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                        [10] == hash.super_base_blob<256U>.m_data._M_elems[10]);
        auVar27[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xb] == hash.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar27[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xc] == hash.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar27[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xd] == hash.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar27[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xe] == hash.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar27[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0xf] == hash.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar24[0] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x10] == hash.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar24[1] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x11] == hash.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar24[2] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x12] == hash.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar24[3] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x13] == hash.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar24[4] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x14] == hash.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar24[5] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x15] == hash.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar24[6] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x16] == hash.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar24[7] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x17] == hash.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar24[8] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x18] == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar24[9] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                       [0x19] == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar24[10] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data._M_elems
                        [0x1a] == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar24[0xb] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1b] == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar24[0xc] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1c] == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar24[0xd] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1d] == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar24[0xe] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1e] == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar24[0xf] = -((__nbytes->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                         _M_elems[0x1f] == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar24 = auVar24 & auVar27;
        if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
          GetAll(&local_268,this);
          ppCVar6 = local_268.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (local_268.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_268.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_2d4 = 0;
          }
          else {
            local_2d4 = 0;
            ppCVar1 = local_268.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              ppCVar21 = ppCVar1 + 1;
              state_1.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
              state_1.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
              state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p
                   = (pointer)&state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                               field_2;
              state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length
                   = 0;
              state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
              _M_local_buf[0] = '\0';
              state_1.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p
                   = (pointer)&state_1.super_ValidationState<BlockValidationResult>.m_debug_message.
                               field_2;
              state_1.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length
                   = 0;
              state_1.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
              _M_local_buf[0] = '\0';
              local_278 = (undefined1  [16])0x0;
              pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar18;
              pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_278;
              bVar8 = Chainstate::ActivateBestChain(*ppCVar1,&state_1,pblock);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
              }
              if (!bVar8) {
                local_2d4 = 1;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)state_1.super_ValidationState<BlockValidationResult>.m_debug_message.
                     _M_dataplus._M_p !=
                  &state_1.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
                operator_delete(state_1.super_ValidationState<BlockValidationResult>.m_debug_message
                                ._M_dataplus._M_p,
                                CONCAT71(state_1.super_ValidationState<BlockValidationResult>.
                                         m_debug_message.field_2._M_allocated_capacity._1_7_,
                                         state_1.super_ValidationState<BlockValidationResult>.
                                         m_debug_message.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                     _M_dataplus._M_p !=
                  &state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2) {
                operator_delete(state_1.super_ValidationState<BlockValidationResult>.m_reject_reason
                                ._M_dataplus._M_p,
                                CONCAT71(state_1.super_ValidationState<BlockValidationResult>.
                                         m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                         state_1.super_ValidationState<BlockValidationResult>.
                                         m_reject_reason.field_2._M_local_buf[0]) + 1);
              }
              ppCVar1 = ppCVar21;
            } while (bVar8 && ppCVar21 != ppCVar6);
          }
          if (local_268.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_268.
                            super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_268.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_268.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_2d4 == 0) goto LAB_004095d7;
LAB_00409805:
          iVar10 = local_2d4 * 3;
        }
        else {
LAB_004095d7:
          if (((this->m_blockman).m_prune_mode == true) &&
             (bVar16 = ppuVar20 != (_Map_pointer)0x0 &
                       (this->m_blockman).m_blockfiles_indexed._M_base._M_i,
             pcVar18 = (char *)CONCAT71((int7)((ulong)pcVar18 >> 8),bVar16), bVar16 == 1)) {
            GetAll(&local_290,this);
            ppCVar6 = local_290.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (local_290.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_290.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_2d4 = 0;
            }
            else {
              local_2d4 = 0;
              ppCVar1 = local_290.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                ppCVar21 = ppCVar1 + 1;
                this_01 = *ppCVar1;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                                super__Deque_impl_data._M_start._M_first;
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._0_16_ = auVar4 << 0x40;
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_start._0_9_ = ZEXT89(0);
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_start._M_node =
                     &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first;
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_finish._0_9_ = ZEXT89(0);
                local_298 = local_300;
                if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_300->_M_use_count = local_300->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_300->_M_use_count = local_300->_M_use_count + 1;
                  }
                }
                pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar18;
                pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_2a0;
                local_2a0 = ppuVar20;
                bVar8 = Chainstate::ActivateBestChain
                                  (this_01,(BlockValidationState *)&queue,pblock_00);
                if (local_298 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298);
                }
                if (!bVar8) {
                  pLVar13 = LogInstance();
                  bVar9 = BCLog::Logger::WillLogCategoryLevel(pLVar13,REINDEX,Debug);
                  pcVar18 = (char *)CONCAT71((int7)((ulong)pcVar18 >> 8),1);
                  local_2d4 = (uint)pcVar18;
                  if (bVar9) {
                    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                              ((string *)&dummy,(ValidationState<BlockValidationResult> *)&queue);
                    logging_function_01._M_str = "LoadExternalBlockFile";
                    logging_function_01._M_len = 0x15;
                    source_file_01._M_str =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ;
                    source_file_01._M_len = 0x5e;
                    pcVar18 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ;
                    LogPrintFormatInternal<std::__cxx11::string>
                              (logging_function_01,source_file_01,0x140f,REINDEX,Debug,
                               (ConstevalFormatString<1U>)0x7e8aa1,(string *)&dummy);
                    if ((size_type *)dummy.super_ValidationState<BlockValidationResult>._0_8_ !=
                        &dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                         _M_string_length) {
                      operator_delete((void *)dummy.super_ValidationState<BlockValidationResult>.
                                              _0_8_,
                                      dummy.super_ValidationState<BlockValidationResult>.
                                      m_reject_reason._M_string_length + 1);
                    }
                  }
                }
                if (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node !=
                    &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first) {
                  operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl
                                  .super__Deque_impl_data._M_start._M_node,
                                  (ulong)(((queue.
                                            super__Deque_base<uint256,_std::allocator<uint256>_>.
                                            _M_impl.super__Deque_impl_data._M_finish._M_first)->
                                          super_base_blob<256U>).m_data._M_elems + 1));
                }
                if ((_Elt_pointer *)
                    queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Deque_impl_data._M_map_size !=
                    &queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_start._M_first) {
                  operator_delete((void *)queue.super__Deque_base<uint256,_std::allocator<uint256>_>
                                          ._M_impl.super__Deque_impl_data._M_map_size,
                                  (ulong)(((queue.
                                            super__Deque_base<uint256,_std::allocator<uint256>_>.
                                            _M_impl.super__Deque_impl_data._M_start._M_first)->
                                          super_base_blob<256U>).m_data._M_elems + 1));
                }
                ppCVar1 = ppCVar21;
              } while (bVar8 && ppCVar21 != ppCVar6);
            }
            if (local_290.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_290.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_290.
                                    super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_290.
                                    super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if ((local_2d4 & 1) != 0) {
              local_2d4 = local_2d4 & 0xff;
              goto LAB_00409805;
            }
          }
          NotifyHeaderTip(this);
          if (blocks_with_unknown_parent ==
              (multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
               *)0x0) {
            iVar10 = 2;
          }
          else {
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_map = (_Map_pointer)0x0;
            queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Deque_impl_data._M_map_size = 0;
            std::_Deque_base<uint256,_std::allocator<uint256>_>::_M_initialize_map
                      (&queue.super__Deque_base<uint256,_std::allocator<uint256>_>,0);
            if (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<uint256,std::allocator<uint256>>::_M_push_back_aux<uint256_const&>
                        ((deque<uint256,std::allocator<uint256>> *)&queue,&hash);
            }
            else {
              *(ulong *)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_cur)->super_base_blob<256U>).m_data.
                         _M_elems + 0x10) =
                   CONCAT17(hash.super_base_blob<256U>.m_data._M_elems[0x17],
                            CONCAT16(hash.super_base_blob<256U>.m_data._M_elems[0x16],
                                     CONCAT15(hash.super_base_blob<256U>.m_data._M_elems[0x15],
                                              CONCAT14(hash.super_base_blob<256U>.m_data._M_elems
                                                       [0x14],CONCAT13(hash.super_base_blob<256U>.
                                                                       m_data._M_elems[0x13],
                                                                       CONCAT12(hash.
                                                  super_base_blob<256U>.m_data._M_elems[0x12],
                                                  CONCAT11(hash.super_base_blob<256U>.m_data.
                                                           _M_elems[0x11],
                                                           hash.super_base_blob<256U>.m_data.
                                                           _M_elems[0x10])))))));
              *(ulong *)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_cur)->super_base_blob<256U>).m_data.
                         _M_elems + 0x18) =
                   CONCAT17(hash.super_base_blob<256U>.m_data._M_elems[0x1f],
                            CONCAT16(hash.super_base_blob<256U>.m_data._M_elems[0x1e],
                                     CONCAT15(hash.super_base_blob<256U>.m_data._M_elems[0x1d],
                                              CONCAT14(hash.super_base_blob<256U>.m_data._M_elems
                                                       [0x1c],CONCAT13(hash.super_base_blob<256U>.
                                                                       m_data._M_elems[0x1b],
                                                                       CONCAT12(hash.
                                                  super_base_blob<256U>.m_data._M_elems[0x1a],
                                                  CONCAT11(hash.super_base_blob<256U>.m_data.
                                                           _M_elems[0x19],
                                                           hash.super_base_blob<256U>.m_data.
                                                           _M_elems[0x18])))))));
              *(ulong *)((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur)->super_base_blob<256U>).m_data.
                        _M_elems =
                   CONCAT17(hash.super_base_blob<256U>.m_data._M_elems[7],
                            CONCAT16(hash.super_base_blob<256U>.m_data._M_elems[6],
                                     CONCAT15(hash.super_base_blob<256U>.m_data._M_elems[5],
                                              CONCAT14(hash.super_base_blob<256U>.m_data._M_elems[4]
                                                       ,CONCAT13(hash.super_base_blob<256U>.m_data.
                                                                 _M_elems[3],
                                                                 CONCAT12(hash.super_base_blob<256U>
                                                                          .m_data._M_elems[2],
                                                                          CONCAT11(hash.
                                                  super_base_blob<256U>.m_data._M_elems[1],
                                                  hash.super_base_blob<256U>.m_data._M_elems[0])))))
                                    ));
              *(ulong *)(((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_cur)->super_base_blob<256U>).m_data.
                         _M_elems + 8) =
                   CONCAT17(hash.super_base_blob<256U>.m_data._M_elems[0xf],
                            CONCAT16(hash.super_base_blob<256U>.m_data._M_elems[0xe],
                                     CONCAT15(hash.super_base_blob<256U>.m_data._M_elems[0xd],
                                              CONCAT14(hash.super_base_blob<256U>.m_data._M_elems
                                                       [0xc],CONCAT13(hash.super_base_blob<256U>.
                                                                      m_data._M_elems[0xb],
                                                                      CONCAT12(hash.
                                                  super_base_blob<256U>.m_data._M_elems[10],
                                                  CONCAT11(hash.super_base_blob<256U>.m_data.
                                                           _M_elems[9],
                                                           hash.super_base_blob<256U>.m_data.
                                                           _M_elems[8])))))));
              queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur =
                   queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur + 1;
            }
            while( true ) {
              if (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur ==
                  queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) break;
              criticalblock38.super_unique_lock._M_device =
                   *(mutex_type **)
                    ((queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur)->super_base_blob<256U>).m_data.
                    _M_elems;
              pbVar5 = &(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Deque_impl_data._M_start._M_cur)->super_base_blob<256U>;
              criticalblock38.super_unique_lock._M_owns = (bool)(pbVar5->m_data)._M_elems[8];
              criticalblock38.super_unique_lock._9_1_ = (pbVar5->m_data)._M_elems[9];
              criticalblock38.super_unique_lock._10_1_ = (pbVar5->m_data)._M_elems[10];
              criticalblock38.super_unique_lock._11_1_ = (pbVar5->m_data)._M_elems[0xb];
              criticalblock38.super_unique_lock._12_1_ = (pbVar5->m_data)._M_elems[0xc];
              criticalblock38.super_unique_lock._13_1_ = (pbVar5->m_data)._M_elems[0xd];
              criticalblock38.super_unique_lock._14_1_ = (pbVar5->m_data)._M_elems[0xe];
              criticalblock38.super_unique_lock._15_1_ = (pbVar5->m_data)._M_elems[0xf];
              if (queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur ==
                  queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Deque_impl_data._M_start._M_last + -1) {
                operator_delete(queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                                super__Deque_impl_data._M_start._M_first,0x200);
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur =
                     queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_start._M_node[1];
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_start._M_node =
                     queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_start._M_node + 1;
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_start._M_last =
                     queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur + 0x10;
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_start._M_first =
                     queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
              }
              else {
                queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur =
                     queue.super__Deque_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur + 1;
              }
              pVar28 = std::
                       _Rb_tree<uint256,_std::pair<const_uint256,_FlatFilePos>,_std::_Select1st<std::pair<const_uint256,_FlatFilePos>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                       ::equal_range(&blocks_with_unknown_parent->_M_t,(key_type *)&criticalblock38)
              ;
              __position._M_node = pVar28.first._M_node._M_node;
              while (__position._M_node != pVar28.second._M_node._M_node) {
                pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<CBlock,std::allocator<CBlock>>
                          (&pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(CBlock **)&pblockrecursive,
                           (allocator<CBlock> *)(local_198 + 0x10));
                bVar8 = ::node::BlockManager::ReadBlockFromDisk
                                  (this_00,pblockrecursive.
                                           super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr,(FlatFilePos *)(__position._M_node + 2));
                if (bVar8) {
                  pLVar13 = LogInstance();
                  bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar13,REINDEX,Debug);
                  if (bVar8) {
                    CBlockHeader::GetHash
                              ((uint256 *)(local_198 + 0x10),
                               &(pblockrecursive.
                                 super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                                super_CBlockHeader);
                    base_blob<256u>::ToString_abi_cxx11_
                              ((string *)&dummy,(uint256 *)(local_198 + 0x10));
                    base_blob<256u>::ToString_abi_cxx11_
                              ((string *)&criticalblock39,&criticalblock38);
                    logging_function_02._M_str = "LoadExternalBlockFile";
                    logging_function_02._M_len = 0x15;
                    source_file_02._M_str =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ;
                    source_file_02._M_len = 0x5e;
                    LogPrintFormatInternal<char[22],std::__cxx11::string,std::__cxx11::string>
                              (logging_function_02,source_file_02,0x1429,REINDEX,Debug,
                               (ConstevalFormatString<3U>)0x8233e0,
                               (char (*) [22])"LoadExternalBlockFile",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &dummy,(string *)&criticalblock39);
                    if (criticalblock39.super_unique_lock._M_device != (mutex_type *)local_198) {
                      operator_delete(criticalblock39.super_unique_lock._M_device,
                                      local_198._0_8_ + 1);
                    }
                    if ((size_type *)dummy.super_ValidationState<BlockValidationResult>._0_8_ !=
                        &dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                         _M_string_length) {
                      operator_delete((void *)dummy.super_ValidationState<BlockValidationResult>.
                                              _0_8_,
                                      dummy.super_ValidationState<BlockValidationResult>.
                                      m_reject_reason._M_string_length + 1);
                    }
                  }
                  criticalblock39.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
                  criticalblock39.super_unique_lock._M_owns = false;
                  std::unique_lock<std::recursive_mutex>::lock(&criticalblock39.super_unique_lock);
                  dummy.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
                  dummy.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
                  dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus.
                  _M_p = (pointer)&dummy.super_ValidationState<BlockValidationResult>.
                                   m_reject_reason.field_2;
                  dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                  _M_string_length = 0;
                  dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                  _M_local_buf[0] = '\0';
                  dummy.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus.
                  _M_p = (pointer)&dummy.super_ValidationState<BlockValidationResult>.
                                   m_debug_message.field_2;
                  dummy.super_ValidationState<BlockValidationResult>.m_debug_message.
                  _M_string_length = 0;
                  dummy.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
                  _M_local_buf[0] = '\0';
                  local_188.super_base_blob<256U>.m_data._M_elems._0_8_ =
                       pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  local_188.super_base_blob<256U>.m_data._M_elems._8_8_ =
                       pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
                  if (pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  bVar8 = AcceptBlock(this,(shared_ptr<const_CBlock> *)(local_198 + 0x10),&dummy,
                                      (CBlockIndex **)0x0,true,
                                      (FlatFilePos *)(__position._M_node + 2),(bool *)0x0,true);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_188.super_base_blob<256U>.m_data._M_elems._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_188.super_base_blob<256U>.m_data._M_elems._8_8_);
                  }
                  if (bVar8) {
                    nLoaded = nLoaded + 1;
                    CBlockHeader::GetHash
                              ((uint256 *)(local_198 + 0x10),
                               &(pblockrecursive.
                                 super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                                super_CBlockHeader);
                    std::deque<uint256,_std::allocator<uint256>_>::emplace_back<uint256>
                              (&queue,(uint256 *)(local_198 + 0x10));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)dummy.super_ValidationState<BlockValidationResult>.m_debug_message.
                         _M_dataplus._M_p !=
                      &dummy.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
                    operator_delete(dummy.super_ValidationState<BlockValidationResult>.
                                    m_debug_message._M_dataplus._M_p,
                                    CONCAT71(dummy.super_ValidationState<BlockValidationResult>.
                                             m_debug_message.field_2._M_allocated_capacity._1_7_,
                                             dummy.super_ValidationState<BlockValidationResult>.
                                             m_debug_message.field_2._M_local_buf[0]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.
                         _M_dataplus._M_p !=
                      &dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2) {
                    operator_delete(dummy.super_ValidationState<BlockValidationResult>.
                                    m_reject_reason._M_dataplus._M_p,
                                    CONCAT71(dummy.super_ValidationState<BlockValidationResult>.
                                             m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                             dummy.super_ValidationState<BlockValidationResult>.
                                             m_reject_reason.field_2._M_local_buf[0]) + 1);
                  }
                  std::unique_lock<std::recursive_mutex>::~unique_lock
                            (&criticalblock39.super_unique_lock);
                }
                p_Var14 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
                ::erase_abi_cxx11_((_Rb_tree<uint256,std::pair<uint256_const,FlatFilePos>,std::_Select1st<std::pair<uint256_const,FlatFilePos>>,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
                                    *)blocks_with_unknown_parent,__position);
                NotifyHeaderTip(this);
                __position._M_node = p_Var14;
                if (pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (pblockrecursive.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
              }
            }
            std::_Deque_base<uint256,_std::allocator<uint256>_>::~_Deque_base
                      (&queue.super__Deque_base<uint256,_std::allocator<uint256>_>);
            iVar10 = 0;
          }
        }
      }
      if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300);
      }
      bVar8 = iVar10 == 3;
      uVar19 = local_2f0;
    }
    else {
      bVar8 = false;
    }
    if (bVar8) break;
  }
  if (blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)blkdat.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar15 = std::chrono::_V2::steady_clock::now();
  _buf = (lVar15 - lVar11) / 1000000;
  logging_function_03._M_str = "LoadExternalBlockFile";
  logging_function_03._M_len = 0x15;
  source_file_03._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file_03._M_len = 0x5e;
  LogPrintFormatInternal<int,long>
            (logging_function_03,source_file_03,0x1448,ALL,Info,(ConstevalFormatString<2U>)0x823479,
             &nLoaded,(long *)&buf);
LAB_0040a116:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChainstateManager::LoadExternalBlockFile(
    AutoFile& file_in,
    FlatFilePos* dbp,
    std::multimap<uint256, FlatFilePos>* blocks_with_unknown_parent)
{
    // Either both should be specified (-reindex), or neither (-loadblock).
    assert(!dbp == !blocks_with_unknown_parent);

    const auto start{SteadyClock::now()};
    const CChainParams& params{GetParams()};

    int nLoaded = 0;
    try {
        BufferedFile blkdat{file_in, 2 * MAX_BLOCK_SERIALIZED_SIZE, MAX_BLOCK_SERIALIZED_SIZE + 8};
        // nRewind indicates where to resume scanning in case something goes wrong,
        // such as a block fails to deserialize.
        uint64_t nRewind = blkdat.GetPos();
        while (!blkdat.eof()) {
            if (m_interrupt) return;

            blkdat.SetPos(nRewind);
            nRewind++; // start one byte further next time, in case of failure
            blkdat.SetLimit(); // remove former limit
            unsigned int nSize = 0;
            try {
                // locate a header
                MessageStartChars buf;
                blkdat.FindByte(std::byte(params.MessageStart()[0]));
                nRewind = blkdat.GetPos() + 1;
                blkdat >> buf;
                if (buf != params.MessageStart()) {
                    continue;
                }
                // read size
                blkdat >> nSize;
                if (nSize < 80 || nSize > MAX_BLOCK_SERIALIZED_SIZE)
                    continue;
            } catch (const std::exception&) {
                // no valid block header found; don't complain
                // (this happens at the end of every blk.dat file)
                break;
            }
            try {
                // read block header
                const uint64_t nBlockPos{blkdat.GetPos()};
                if (dbp)
                    dbp->nPos = nBlockPos;
                blkdat.SetLimit(nBlockPos + nSize);
                CBlockHeader header;
                blkdat >> header;
                const uint256 hash{header.GetHash()};
                // Skip the rest of this block (this may read from disk into memory); position to the marker before the
                // next block, but it's still possible to rewind to the start of the current block (without a disk read).
                nRewind = nBlockPos + nSize;
                blkdat.SkipTo(nRewind);

                std::shared_ptr<CBlock> pblock{}; // needs to remain available after the cs_main lock is released to avoid duplicate reads from disk

                {
                    LOCK(cs_main);
                    // detect out of order blocks, and store them for later
                    if (hash != params.GetConsensus().hashGenesisBlock && !m_blockman.LookupBlockIndex(header.hashPrevBlock)) {
                        LogDebug(BCLog::REINDEX, "%s: Out of order block %s, parent %s not known\n", __func__, hash.ToString(),
                                 header.hashPrevBlock.ToString());
                        if (dbp && blocks_with_unknown_parent) {
                            blocks_with_unknown_parent->emplace(header.hashPrevBlock, *dbp);
                        }
                        continue;
                    }

                    // process in case the block isn't known yet
                    const CBlockIndex* pindex = m_blockman.LookupBlockIndex(hash);
                    if (!pindex || (pindex->nStatus & BLOCK_HAVE_DATA) == 0) {
                        // This block can be processed immediately; rewind to its start, read and deserialize it.
                        blkdat.SetPos(nBlockPos);
                        pblock = std::make_shared<CBlock>();
                        blkdat >> TX_WITH_WITNESS(*pblock);
                        nRewind = blkdat.GetPos();

                        BlockValidationState state;
                        if (AcceptBlock(pblock, state, nullptr, true, dbp, nullptr, true)) {
                            nLoaded++;
                        }
                        if (state.IsError()) {
                            break;
                        }
                    } else if (hash != params.GetConsensus().hashGenesisBlock && pindex->nHeight % 1000 == 0) {
                        LogDebug(BCLog::REINDEX, "Block Import: already had block %s at height %d\n", hash.ToString(), pindex->nHeight);
                    }
                }

                // Activate the genesis block so normal node progress can continue
                if (hash == params.GetConsensus().hashGenesisBlock) {
                    bool genesis_activation_failure = false;
                    for (auto c : GetAll()) {
                        BlockValidationState state;
                        if (!c->ActivateBestChain(state, nullptr)) {
                            genesis_activation_failure = true;
                            break;
                        }
                    }
                    if (genesis_activation_failure) {
                        break;
                    }
                }

                if (m_blockman.IsPruneMode() && m_blockman.m_blockfiles_indexed && pblock) {
                    // must update the tip for pruning to work while importing with -loadblock.
                    // this is a tradeoff to conserve disk space at the expense of time
                    // spent updating the tip to be able to prune.
                    // otherwise, ActivateBestChain won't be called by the import process
                    // until after all of the block files are loaded. ActivateBestChain can be
                    // called by concurrent network message processing. but, that is not
                    // reliable for the purpose of pruning while importing.
                    bool activation_failure = false;
                    for (auto c : GetAll()) {
                        BlockValidationState state;
                        if (!c->ActivateBestChain(state, pblock)) {
                            LogDebug(BCLog::REINDEX, "failed to activate chain (%s)\n", state.ToString());
                            activation_failure = true;
                            break;
                        }
                    }
                    if (activation_failure) {
                        break;
                    }
                }

                NotifyHeaderTip();

                if (!blocks_with_unknown_parent) continue;

                // Recursively process earlier encountered successors of this block
                std::deque<uint256> queue;
                queue.push_back(hash);
                while (!queue.empty()) {
                    uint256 head = queue.front();
                    queue.pop_front();
                    auto range = blocks_with_unknown_parent->equal_range(head);
                    while (range.first != range.second) {
                        std::multimap<uint256, FlatFilePos>::iterator it = range.first;
                        std::shared_ptr<CBlock> pblockrecursive = std::make_shared<CBlock>();
                        if (m_blockman.ReadBlockFromDisk(*pblockrecursive, it->second)) {
                            LogDebug(BCLog::REINDEX, "%s: Processing out of order child %s of %s\n", __func__, pblockrecursive->GetHash().ToString(),
                                    head.ToString());
                            LOCK(cs_main);
                            BlockValidationState dummy;
                            if (AcceptBlock(pblockrecursive, dummy, nullptr, true, &it->second, nullptr, true)) {
                                nLoaded++;
                                queue.push_back(pblockrecursive->GetHash());
                            }
                        }
                        range.first++;
                        blocks_with_unknown_parent->erase(it);
                        NotifyHeaderTip();
                    }
                }
            } catch (const std::exception& e) {
                // historical bugs added extra data to the block files that does not deserialize cleanly.
                // commonly this data is between readable blocks, but it does not really matter. such data is not fatal to the import process.
                // the code that reads the block files deals with invalid data by simply ignoring it.
                // it continues to search for the next {4 byte magic message start bytes + 4 byte length + block} that does deserialize cleanly
                // and passes all of the other block validation checks dealing with POW and the merkle root, etc...
                // we merely note with this informational log message when unexpected data is encountered.
                // we could also be experiencing a storage system read error, or a read of a previous bad write. these are possible, but
                // less likely scenarios. we don't have enough information to tell a difference here.
                // the reindex process is not the place to attempt to clean and/or compact the block files. if so desired, a studious node operator
                // may use knowledge of the fact that the block files are not entirely pristine in order to prepare a set of pristine, and
                // perhaps ordered, block files for later reindexing.
                LogDebug(BCLog::REINDEX, "%s: unexpected data at file offset 0x%x - %s. continuing\n", __func__, (nRewind - 1), e.what());
            }
        }
    } catch (const std::runtime_error& e) {
        GetNotifications().fatalError(strprintf(_("System error while loading external block file: %s"), e.what()));
    }
    LogPrintf("Loaded %i blocks from external file in %dms\n", nLoaded, Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
}